

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAnnotationObjectHelper.cc
# Opt level: O0

int __thiscall QPDFAnnotationObjectHelper::getFlags(QPDFAnnotationObjectHelper *this)

{
  bool bVar1;
  int local_7c;
  allocator<char> local_51;
  string local_50 [32];
  QPDFObjectHandle flags_obj;
  QPDFAnnotationObjectHelper *this_local;
  
  flags_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"/F",&local_51);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)&stack0xffffffffffffffe0,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&stack0xffffffffffffffe0);
  if (bVar1) {
    local_7c = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&stack0xffffffffffffffe0);
  }
  else {
    local_7c = 0;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffe0);
  return local_7c;
}

Assistant:

int
QPDFAnnotationObjectHelper::getFlags()
{
    QPDFObjectHandle flags_obj = oh().getKey("/F");
    return flags_obj.isInteger() ? flags_obj.getIntValueAsInt() : 0;
}